

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O3

type __thiscall
robin_hood::detail::
Table<true,80ul,Rml::Element*,itlib::flat_map<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>>>>,robin_hood::hash<Rml::Element*,void>,std::equal_to<Rml::Element*>>
::
doCreateByKey<Rml::Element*const&,itlib::flat_map<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>>>>>
          (Table<true,80ul,Rml::Element*,itlib::flat_map<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>,itlib::fmimpl::less,std::vector<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>,std::allocator<std::pair<std::__cxx11::string,std::vector<Rml::DataAddressEntry,std::allocator<Rml::DataAddressEntry>>>>>>,robin_hood::hash<Rml::Element*,void>,std::equal_to<Rml::Element*>>
           *this,Element **key)

{
  char *pcVar1;
  byte *pbVar2;
  byte bVar3;
  int iVar4;
  Element *pEVar5;
  pointer *pppVar6;
  long lVar7;
  long lVar8;
  ulong *puVar9;
  uint uVar10;
  ulong uVar11;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>
  local_68;
  Element *local_50;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>
  local_48;
  
  while( true ) {
    pEVar5 = *key;
    uVar11 = ((long)pEVar5 << 0x20 | (ulong)pEVar5 >> 0x20) * -0x604de39ae16720db +
             (long)pEVar5 * -0x5db4512b69c11bf9;
    uVar10 = ((uint)(uVar11 >> 0x20) & 0x1f) >> ((byte)this[0x2c] & 0x3f);
    iVar4 = *(int *)(this + 0x28);
    uVar11 = (uVar11 << 0x20 | uVar11 >> 0x20) >> 5 & *(ulong *)(this + 0x18);
    lVar8 = *(long *)(this + 8);
    bVar3 = *(byte *)(lVar8 + uVar11);
    while( true ) {
      uVar10 = uVar10 + iVar4;
      if (bVar3 <= uVar10) break;
      bVar3 = *(byte *)(lVar8 + 1 + uVar11);
      uVar11 = uVar11 + 1;
    }
    if (uVar10 == bVar3) {
      pppVar6 = (pointer *)(*(long *)this + uVar11 * 0x20 + 8);
      do {
        if (pEVar5 == (Element *)pppVar6[-1]) {
          return (type)pppVar6;
        }
        uVar10 = uVar10 + iVar4;
        pbVar2 = (byte *)(lVar8 + 1 + uVar11);
        uVar11 = uVar11 + 1;
        pppVar6 = pppVar6 + 4;
      } while (uVar10 == *pbVar2);
    }
    if (*(ulong *)(this + 0x10) < *(ulong *)(this + 0x20)) break;
    Table<true,_80UL,_Rml::Element_*,_itlib::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>_>,_robin_hood::hash<Rml::Element_*,_void>,_std::equal_to<Rml::Element_*>_>
    ::increase_size((Table<true,_80UL,_Rml::Element_*,_itlib::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>_>,_robin_hood::hash<Rml::Element_*,_void>,_std::equal_to<Rml::Element_*>_>
                     *)this);
  }
  if (0xff < iVar4 + uVar10) {
    *(undefined8 *)(this + 0x20) = 0;
  }
  lVar7 = 1;
  do {
    lVar7 = lVar7 + -1;
    pcVar1 = (char *)(lVar8 + uVar11);
    lVar8 = lVar8 + 1;
  } while (*pcVar1 != '\0');
  puVar9 = (ulong *)(*(long *)this + uVar11 * 0x20);
  if (lVar7 == 0) {
    *puVar9 = (ulong)pEVar5;
    puVar9[1] = 0;
    puVar9[2] = 0;
    puVar9[3] = 0;
  }
  else {
    Table<true,_80UL,_Rml::Element_*,_itlib::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>_>,_robin_hood::hash<Rml::Element_*,_void>,_std::equal_to<Rml::Element_*>_>
    ::shiftUp((Table<true,_80UL,_Rml::Element_*,_itlib::flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>_>,_robin_hood::hash<Rml::Element_*,_void>,_std::equal_to<Rml::Element_*>_>
               *)this,uVar11 - lVar7,uVar11);
    local_50 = *key;
    *puVar9 = (ulong)local_50;
    local_68.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)puVar9[3];
    local_68.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)puVar9[1];
    local_68.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)puVar9[2];
    puVar9[1] = 0;
    puVar9[2] = 0;
    puVar9[3] = 0;
    local_48.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>
    ::~vector(&local_68);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<Rml::DataAddressEntry,_std::allocator<Rml::DataAddressEntry>_>_>_>_>
    ::~vector(&local_48);
  }
  *(char *)(*(long *)(this + 8) + uVar11) = (char)uVar10;
  *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  return (type)(*(long *)this + uVar11 * 0x20 + 8);
}

Assistant:

typename std::enable_if<!std::is_void<Q>::value, Q&>::type doCreateByKey(Arg&& key) {
        while (true) {
            size_t idx{};
            InfoType info{};
            keyToIdx(key, &idx, &info);
            nextWhileLess(&info, &idx);

            // while we potentially have a match. Can't do a do-while here because when mInfo is
            // 0 we don't want to skip forward
            while (info == mInfo[idx]) {
                if (WKeyEqual::operator()(key, mKeyVals[idx].getFirst())) {
                    // key already exists, do not insert.
                    return mKeyVals[idx].getSecond();
                }
                next(&info, &idx);
            }

            // unlikely that this evaluates to true
            if (ROBIN_HOOD_UNLIKELY(mNumElements >= mMaxNumElementsAllowed)) {
                increase_size();
                continue;
            }

            // key not found, so we are now exactly where we want to insert it.
            auto const insertion_idx = idx;
            auto const insertion_info = info;
            if (ROBIN_HOOD_UNLIKELY(insertion_info + mInfoInc > 0xFF)) {
                mMaxNumElementsAllowed = 0;
            }

            // find an empty spot
            while (0 != mInfo[idx]) {
                next(&info, &idx);
            }

            auto& l = mKeyVals[insertion_idx];
            if (idx == insertion_idx) {
                // put at empty spot. This forwards all arguments into the node where the object
                // is constructed exactly where it is needed.
                ::new (static_cast<void*>(&l))
                    Node(*this, std::piecewise_construct,
                         std::forward_as_tuple(std::forward<Arg>(key)), std::forward_as_tuple());
            } else {
                shiftUp(idx, insertion_idx);
                l = Node(*this, std::piecewise_construct,
                         std::forward_as_tuple(std::forward<Arg>(key)), std::forward_as_tuple());
            }

            // mKeyVals[idx].getFirst() = std::move(key);
            mInfo[insertion_idx] = static_cast<uint8_t>(insertion_info);

            ++mNumElements;
            return mKeyVals[insertion_idx].getSecond();
        }
    }